

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O0

int Gia_ObjToLit(Gia_Man_t *p,Gia_Obj_t *pObj)

{
  int iVar1;
  int c;
  Gia_Obj_t *pObj_00;
  Gia_Obj_t *pObj_local;
  Gia_Man_t *p_local;
  
  pObj_00 = Gia_Regular(pObj);
  iVar1 = Gia_ObjId(p,pObj_00);
  c = Gia_IsComplement(pObj);
  iVar1 = Abc_Var2Lit(iVar1,c);
  return iVar1;
}

Assistant:

static inline int          Gia_ObjToLit( Gia_Man_t * p, Gia_Obj_t * pObj )     { return Abc_Var2Lit( Gia_ObjId(p, Gia_Regular(pObj)), Gia_IsComplement(pObj) ); }